

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_function_bind(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  JSRefCountHeader *p_3;
  int iVar4;
  JSValueUnion JVar5;
  JSValueUnion *pJVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  JSRefCountHeader *p;
  JSValueUnion JVar10;
  ulong uVar11;
  JSValueUnion JVar12;
  uint uVar13;
  double dVar14;
  anon_union_8_2_94730072 u;
  double dVar15;
  JSValue this_obj;
  JSValue JVar16;
  JSValue val;
  
  JVar10 = this_val.u;
  iVar3 = check_function(ctx,this_val);
  if (iVar3 != 0) goto LAB_0016030a;
  this_obj = JS_NewObjectProtoClass(ctx,ctx->function_proto,0xe);
  JVar5 = this_obj.u;
  if ((uint)this_obj.tag == 6) goto LAB_0016030a;
  if ((uint)this_val.tag == 0xffffffff) {
    bVar8 = *(byte *)((long)JVar10.ptr + 5) & 0x10;
  }
  else {
    bVar8 = 0;
  }
  *(byte *)((long)JVar5.ptr + 5) = *(byte *)((long)JVar5.ptr + 5) & 0xef | bVar8;
  iVar3 = 1;
  if (1 < argc) {
    iVar3 = argc;
  }
  uVar13 = iVar3 - 1;
  pJVar6 = (JSValueUnion *)js_malloc(ctx,(ulong)uVar13 * 0x10 + 0x28);
  if (pJVar6 != (JSValueUnion *)0x0) {
    if (0xfffffff4 < (uint)this_val.tag) {
      *(int *)JVar10.ptr = *JVar10.ptr + 1;
    }
    pJVar6->ptr = (void *)JVar10;
    pJVar6[1] = (JSValueUnion)this_val.tag;
    piVar1 = (int *)(argv->u).ptr;
    JVar10 = (JSValueUnion)argv->tag;
    if (0xfffffff4 < (uint)JVar10.int32) {
      *piVar1 = *piVar1 + 1;
    }
    pJVar6[2].ptr = piVar1;
    pJVar6[3] = JVar10;
    pJVar6[4].int32 = uVar13;
    if (1 < argc) {
      lVar7 = 0;
      do {
        piVar1 = *(int **)((long)&argv[1].u + lVar7);
        uVar2 = *(undefined8 *)((long)&argv[1].tag + lVar7);
        if (0xfffffff4 < (uint)uVar2) {
          *piVar1 = *piVar1 + 1;
        }
        *(int **)((long)pJVar6 + lVar7 + 0x28) = piVar1;
        *(undefined8 *)((long)pJVar6 + lVar7 + 0x30) = uVar2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)uVar13 * 0x10 != lVar7);
    }
    *(JSValueUnion **)((long)JVar5.ptr + 0x30) = pJVar6;
    iVar4 = JS_GetOwnProperty(ctx,(JSPropertyDescriptor *)0x0,this_val,0x30);
    if (-1 < iVar4) {
      if (iVar4 == 0) {
LAB_001604d3:
        JVar12.float64 = 0.0;
        JVar10.float64 = 0.0;
      }
      else {
        JVar16 = JS_GetPropertyInternal(ctx,this_val,0x30,this_val,0);
        JVar10 = JVar16.u;
        uVar9 = (uint)JVar16.tag;
        if (uVar9 == 6) goto LAB_0016057e;
        if (uVar9 == 7) {
          if (NAN(JVar10.float64)) {
            dVar15 = 0.0;
          }
          else {
            dVar14 = trunc(JVar10.float64);
            dVar15 = 0.0;
            if ((double)(int)uVar13 < dVar14) {
              dVar15 = dVar14 - (double)(int)uVar13;
            }
          }
          uVar11 = (ulong)dVar15 & 0xffffffff;
          JVar10.float64 = dVar15 & 0xffffffff00000000;
          if (dVar15 == (double)(int)dVar15) {
            uVar11 = (ulong)(uint)(int)dVar15;
            JVar10.float64 = 0.0;
          }
          JVar12.float64 = 3.45845952088873e-323;
          if (dVar15 == (double)(int)dVar15) {
            JVar12.float64 = 0.0;
          }
          JVar10.float64 = uVar11 | JVar10.float64;
        }
        else {
          if (uVar9 != 0) {
            if ((0xfffffff4 < uVar9) &&
               (iVar3 = *JVar10.ptr, *(int *)JVar10.ptr = iVar3 + -1, iVar3 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar16);
            }
            goto LAB_001604d3;
          }
          JVar10._0_4_ = JVar16.u._0_4_ - uVar13;
          JVar12.float64 = 0.0;
          JVar10._4_4_ = 0;
          if (JVar16.u._0_4_ < iVar3) {
            JVar10.float64 = JVar12.float64;
          }
        }
      }
      val.tag = (int64_t)JVar12.ptr;
      val.u.float64 = JVar10.float64;
      JS_DefinePropertyValue(ctx,this_obj,0x30,val,1);
      JVar16 = JS_GetPropertyInternal(ctx,this_val,0x36,this_val,0);
      uVar13 = (uint)JVar16.tag;
      if (uVar13 != 0xfffffff9) {
        if (uVar13 == 6) goto LAB_0016057e;
        if ((0xfffffff4 < uVar13) &&
           (iVar3 = *JVar16.u.ptr, *(int *)JVar16.u.ptr = iVar3 + -1, iVar3 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar16);
        }
        JVar10 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 0x2f))->ptr;
        *(int *)JVar10.ptr = *JVar10.ptr + 1;
        JVar16.tag = -7;
        JVar16.u.ptr = JVar10.ptr;
      }
      JVar16 = JS_ConcatString3(ctx,"bound ",JVar16,"");
      if ((int)JVar16.tag != 6) {
        JS_DefinePropertyValue(ctx,this_obj,0x36,JVar16,1);
        return this_obj;
      }
    }
  }
LAB_0016057e:
  if ((uint)this_obj.tag < 0xfffffff5) {
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  iVar3 = *JVar5.ptr;
  *(int *)JVar5.ptr = iVar3 + -1;
  if (iVar3 < 2) {
    __JS_FreeValueRT(ctx->rt,this_obj);
  }
LAB_0016030a:
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_function_bind(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSBoundFunction *bf;
    JSValue func_obj, name1, len_val;
    JSObject *p;
    int arg_count, i, ret;

    if (check_function(ctx, this_val))
        return JS_EXCEPTION;

    func_obj = JS_NewObjectProtoClass(ctx, ctx->function_proto,
                                 JS_CLASS_BOUND_FUNCTION);
    if (JS_IsException(func_obj))
        return JS_EXCEPTION;
    p = JS_VALUE_GET_OBJ(func_obj);
    p->is_constructor = JS_IsConstructor(ctx, this_val);
    arg_count = max_int(0, argc - 1);
    bf = js_malloc(ctx, sizeof(*bf) + arg_count * sizeof(JSValue));
    if (!bf)
        goto exception;
    bf->func_obj = JS_DupValue(ctx, this_val);
    bf->this_val = JS_DupValue(ctx, argv[0]);
    bf->argc = arg_count;
    for(i = 0; i < arg_count; i++) {
        bf->argv[i] = JS_DupValue(ctx, argv[i + 1]);
    }
    p->u.bound_function = bf;

    /* XXX: the spec could be simpler by only using GetOwnProperty */
    ret = JS_GetOwnProperty(ctx, NULL, this_val, JS_ATOM_length);
    if (ret < 0)
        goto exception;
    if (!ret) {
        len_val = JS_NewInt32(ctx, 0);
    } else {
        len_val = JS_GetProperty(ctx, this_val, JS_ATOM_length);
        if (JS_IsException(len_val))
            goto exception;
        if (JS_VALUE_GET_TAG(len_val) == JS_TAG_INT) {
            /* most common case */
            int len1 = JS_VALUE_GET_INT(len_val);
            if (len1 <= arg_count)
                len1 = 0;
            else
                len1 -= arg_count;
            len_val = JS_NewInt32(ctx, len1);
        } else if (JS_VALUE_GET_NORM_TAG(len_val) == JS_TAG_FLOAT64) {
            double d = JS_VALUE_GET_FLOAT64(len_val);
            if (isnan(d)) {
                d = 0.0;
            } else {
                d = trunc(d);
                if (d <= (double)arg_count)
                    d = 0.0;
                else
                    d -= (double)arg_count; /* also converts -0 to +0 */
            }
            len_val = JS_NewFloat64(ctx, d);
        } else {
            JS_FreeValue(ctx, len_val);
            len_val = JS_NewInt32(ctx, 0);
        }
    }
    JS_DefinePropertyValue(ctx, func_obj, JS_ATOM_length,
                           len_val, JS_PROP_CONFIGURABLE);

    name1 = JS_GetProperty(ctx, this_val, JS_ATOM_name);
    if (JS_IsException(name1))
        goto exception;
    if (!JS_IsString(name1)) {
        JS_FreeValue(ctx, name1);
        name1 = JS_AtomToString(ctx, JS_ATOM_empty_string);
    }
    name1 = JS_ConcatString3(ctx, "bound ", name1, "");
    if (JS_IsException(name1))
        goto exception;
    JS_DefinePropertyValue(ctx, func_obj, JS_ATOM_name, name1,
                           JS_PROP_CONFIGURABLE);
    return func_obj;
 exception:
    JS_FreeValue(ctx, func_obj);
    return JS_EXCEPTION;
}